

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestInstance::iterate
          (TestStatus *__return_storage_ptr__,LineInterpolationTestInstance *this)

{
  pointer pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  float *pfVar3;
  deUint32 width;
  TestLog *log;
  undefined1 auVar4 [16];
  pointer pSVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  float *pfVar11;
  pointer pVVar12;
  ulong *puVar13;
  size_type *psVar14;
  LineInterpolationTestInstance *pLVar15;
  undefined8 uVar16;
  pointer pSVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  undefined4 extraout_XMM0_Da;
  float fVar21;
  float extraout_XMM0_Da_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  string iterationDescription;
  ScopedLogSection section;
  Random rnd;
  Vec4 colors [3];
  IVec4 colorBits;
  undefined1 local_2a8 [24];
  long lStack_290;
  LineInterpolationTestInstance *local_280;
  string local_278;
  undefined1 local_258 [40];
  TestStatus *local_230;
  undefined1 local_228 [32];
  string local_208;
  ScopedLogSection local_1e8;
  RasterizationArguments local_1dc;
  undefined1 local_1c8 [8];
  pointer pSStack_1c0;
  SceneLine local_1b8;
  ios_base local_158 [8];
  ios_base local_150 [272];
  int local_40 [4];
  
  iVar8 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<((ostringstream *)local_1c8,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb4db6c);
  pVVar1 = (pointer)(local_2a8 + 0x10);
  pVVar12 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pVVar12) {
    local_2a8._16_8_ = *(undefined8 *)pVVar12->m_data;
    lStack_290 = plVar9[3];
    local_2a8._0_8_ = pVVar1;
  }
  else {
    local_2a8._16_8_ = *(undefined8 *)pVVar12->m_data;
    local_2a8._0_8_ = (pointer)*plVar9;
  }
  local_2a8._8_8_ = plVar9[1];
  *plVar9 = (long)pVVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_2a8);
  paVar2 = &local_278.field_2;
  puVar13 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_278.field_2._M_allocated_capacity = *puVar13;
    local_278.field_2._8_8_ = plVar9[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar13;
    local_278._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_278._M_string_length = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pSVar5 = (pointer)((long)((Vec4 *)local_258._8_8_)->m_data + local_278._M_string_length);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    uVar16 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < pSVar5) {
    pSVar17 = (pointer)0xf;
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      pSVar17 = (pointer)local_258._16_8_;
    }
    if (pSVar5 <= pSVar17) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_258,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      goto LAB_007c1994;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,local_258._0_8_);
LAB_007c1994:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_208.field_2._M_allocated_capacity = *psVar14;
    local_208.field_2._8_8_ = puVar10[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar14;
    local_208._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_208._M_string_length = puVar10[1];
  *puVar10 = psVar14;
  puVar10[1] = 0;
  *(undefined1 *)psVar14 = 0;
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)((long)((Vec4 *)local_258._16_8_)->m_data + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2a8._0_8_ != pVVar1) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(float *)local_228._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  iVar8 = this->m_iteration;
  local_280 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0xb263e0);
  pLVar15 = local_280;
  psVar14 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_278.field_2._M_allocated_capacity = *psVar14;
    local_278.field_2._8_8_ = plVar9[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar14;
    local_278._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_278._M_string_length = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,&local_278,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2a8._0_8_ != pVVar1) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  (*(pLVar15->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(pLVar15);
  local_230 = (TestStatus *)CONCAT44(local_230._4_4_,extraout_XMM0_Da);
  width = (pLVar15->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_278,width,width);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  local_258._0_8_ = (SceneLine *)0x0;
  local_258._8_8_ = (pointer)0x0;
  if (local_230._0_4_ <= pLVar15->m_maxLineWidth) {
    local_1c8 = (undefined1  [8])0x3f800000;
    pSStack_1c0 = (pointer)0x3f80000000000000;
    local_1b8.positions[0].m_data._0_8_ = (pointer)0x3f80000000000000;
    local_1b8.positions[0].m_data[2] = 0.0;
    local_1b8.positions[0].m_data[3] = 1.0;
    local_1b8.positions[1].m_data[0] = 0.0;
    local_1b8.positions[1].m_data[1] = 0.0;
    local_1b8.positions[1].m_data[2] = 1.0;
    local_1b8.positions[1].m_data[3] = 1.0;
    deRandom_init((deRandom *)&local_1dc,
                  pLVar15->m_iteration * 1000 + pLVar15->m_primitiveTopology + 0x7b);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,6
              );
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,6
              );
    local_230 = __return_storage_ptr__;
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
      lVar20 = 0;
      uVar18 = 0;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar18;
        fVar21 = deRandom_getFloat((deRandom *)&local_1dc);
        *(float *)((long)(float *)local_2a8._0_8_ + lVar20) = fVar21 * 1.8 + -0.9;
        fVar21 = deRandom_getFloat((deRandom *)&local_1dc);
        *(float *)((long)(float *)local_2a8._0_8_ + lVar20 + 4) = fVar21 * 1.8 + -0.9;
        *(undefined4 *)((long)(float *)local_2a8._0_8_ + lVar20 + 8) = 0;
        fVar21 = 1.0;
        if (pLVar15->m_projective == true) {
          fVar21 = deRandom_getFloat((deRandom *)&local_1dc);
          fVar21 = fVar21 * 3.8 + 0.2;
          *(float *)((long)(float *)local_2a8._0_8_ + lVar20) =
               *(float *)((long)(float *)local_2a8._0_8_ + lVar20) * fVar21;
          *(float *)((long)(float *)local_2a8._0_8_ + lVar20 + 4) =
               *(float *)((long)(float *)local_2a8._0_8_ + lVar20 + 4) * fVar21;
          *(float *)((long)(float *)local_2a8._0_8_ + lVar20 + 8) =
               *(float *)((long)(float *)local_2a8._0_8_ + lVar20 + 8) * fVar21;
        }
        *(float *)((long)(float *)local_2a8._0_8_ + lVar20 + 0xc) = fVar21;
        uVar16 = *(undefined8 *)
                  ((long)(local_1c8 +
                         lVar20 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) &
                                  0x1ffffffffffffffe) * -0x18) + 8);
        puVar10 = (undefined8 *)((long)(float *)local_228._0_8_ + lVar20);
        *puVar10 = *(undefined8 *)
                    (local_1c8 +
                    lVar20 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                             -0x18);
        puVar10[1] = uVar16;
        uVar18 = uVar18 + 1;
        lVar20 = lVar20 + 0x10;
      } while ((long)uVar18 < (long)(int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
    }
    if (pLVar15->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
      if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
        iVar8 = 0;
        do {
          lVar19 = (long)iVar8;
          local_1c8 = *(undefined1 (*) [8])((pointer)(local_2a8._0_8_ + lVar19 * 0x10))->m_data;
          pSStack_1c0 = *(pointer *)(((pointer)(local_2a8._0_8_ + lVar19 * 0x10))->m_data + 2);
          local_1b8.positions[0].m_data._0_8_ =
               *(undefined8 *)((pointer)(local_2a8._0_8_ + (long)(iVar8 + 1) * 0x10))->m_data;
          local_1b8.positions[0].m_data._8_8_ =
               *(undefined8 *)(((pointer)(local_2a8._0_8_ + (long)(iVar8 + 1) * 0x10))->m_data + 2);
          local_1b8.positions[1].m_data._0_8_ =
               *(undefined8 *)((pointer)(local_228._0_8_ + lVar19 * 0x10))->m_data;
          local_1b8.positions[1].m_data._8_8_ =
               *(undefined8 *)(((pointer)(local_228._0_8_ + lVar19 * 0x10))->m_data + 2);
          lVar20 = (long)(iVar8 + 1);
          if (local_280->m_flatshade != false) {
            lVar20 = lVar19;
          }
          local_1b8.colors[0].m_data._0_8_ =
               *(undefined8 *)((pointer)(local_228._0_8_ + lVar20 * 0x10))->m_data;
          local_1b8.colors[0].m_data._8_8_ =
               *(undefined8 *)(((pointer)(local_228._0_8_ + lVar20 * 0x10))->m_data + 2);
          std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       *)local_258,(value_type *)local_1c8);
          iVar8 = iVar8 + 2;
        } while (iVar8 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1);
      }
    }
    else if ((pLVar15->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) &&
            (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1)) {
      lVar19 = 0;
      lVar20 = 0;
      do {
        puVar10 = (undefined8 *)((long)(float *)local_2a8._0_8_ + lVar19);
        local_1c8 = (undefined1  [8])*puVar10;
        pSStack_1c0 = (pointer)puVar10[1];
        pfVar3 = (float *)((long)((pointer)(local_2a8._0_8_ + 0x10))->m_data + lVar19);
        local_1b8.positions[0].m_data._0_8_ = *(undefined8 *)pfVar3;
        local_1b8.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar3 = (float *)((long)(float *)local_228._0_8_ + lVar19);
        local_1b8.positions[1].m_data._0_8_ = *(undefined8 *)pfVar3;
        local_1b8.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar11 = (float *)((long)(float *)local_228._0_8_ + lVar19);
        if (local_280->m_flatshade == false) {
          pfVar11 = pfVar3 + 4;
        }
        local_1b8.colors[0].m_data._0_8_ = *(undefined8 *)pfVar11;
        local_1b8.colors[0].m_data._8_8_ = *(undefined8 *)(pfVar11 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   *)local_258,(value_type *)local_1c8);
        lVar20 = lVar20 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar20 < (local_2a8._8_8_ - local_2a8._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
    }
    local_1c8 = (undefined1  [8])
                ((local_280->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1c0,"Generated vertices:",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
    std::ios_base::~ios_base(local_150);
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
      lVar19 = 0;
      lVar20 = 0;
      do {
        local_1c8 = (undefined1  [8])
                    ((local_280->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                    m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,"\t",1);
        tcu::operator<<((ostream *)&pSStack_1c0,
                        (Vector<float,_4> *)((long)(float *)local_2a8._0_8_ + lVar19));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,",\tcolor= ",9);
        tcu::operator<<((ostream *)&pSStack_1c0,
                        (Vector<float,_4> *)((long)(float *)local_228._0_8_ + lVar19));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
        std::ios_base::~ios_base(local_150);
        lVar20 = lVar20 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar20 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
    }
    pLVar15 = local_280;
    BaseRenderingTestInstance::drawPrimitives
              (&local_280->super_BaseRenderingTestInstance,(Surface *)&local_278,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
               local_280->m_primitiveTopology);
    __return_storage_ptr__ = local_230;
    local_1c8 = (undefined1  [8])0x0;
    pSStack_1c0 = (pointer)0x0;
    local_1b8.positions[0].m_data._0_8_ = (pointer)0x0;
    tcu::getTextureFormatBitDepth
              ((tcu *)local_40,&(pLVar15->super_BaseRenderingTestInstance).m_textureFormat);
    auVar6 = local_1c8;
    local_1dc.numSamples = (int)((pLVar15->super_BaseRenderingTestInstance).m_multisampling != 0);
    local_1dc.subpixelBits = (pLVar15->super_BaseRenderingTestInstance).m_subpixelBits;
    local_1dc.redBits = local_40[0];
    local_1dc.greenBits = local_40[1];
    local_1dc.blueBits = local_40[2];
    local_1c8 = (undefined1  [8])local_258._0_8_;
    pSVar5 = (pointer)local_258._8_8_;
    pSVar17 = (pointer)local_258._16_8_;
    local_258._0_8_ = auVar6;
    local_258._8_8_ = pSStack_1c0;
    local_258._16_8_ = local_1b8.positions[0].m_data._0_8_;
    pSStack_1c0 = pSVar5;
    local_1b8.positions[0].m_data._0_8_ = pSVar17;
    (*(pLVar15->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(pLVar15);
    local_1b8.positions[0].m_data[2] = extraout_XMM0_Da_00;
    bVar7 = tcu::verifyTriangulatedLineGroupInterpolation
                      ((Surface *)&local_278,(LineSceneSpec *)local_1c8,&local_1dc,
                       ((pLVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    if (!bVar7) {
      pLVar15->m_allIterationsPassed = false;
    }
    if (local_1c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1c8,local_1b8.positions[0].m_data._0_8_ - (long)local_1c8);
    }
  }
  else {
    local_1c8 = (undefined1  [8])
                ((pLVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,"Line width ",0xb);
    std::ostream::_M_insert<double>((double)local_230._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1c0," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
    std::ios_base::~ios_base(local_150);
  }
  iVar8 = pLVar15->m_iteration + 1;
  pLVar15->m_iteration = iVar8;
  if (iVar8 == pLVar15->m_iterationCount) {
    if (pLVar15->m_allIterationsPassed == true) {
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1c8,
                 (long)pSStack_1c0->positions[0].m_data + (long)((Vec4 *)local_1c8)->m_data);
    }
    else {
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Incorrect rasterization","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1c8,
                 (long)pSStack_1c0->positions[0].m_data + (long)((Vec4 *)local_1c8)->m_data);
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,
                      (ulong)((long)((Vec4 *)local_1b8.positions[0].m_data._0_8_)->m_data + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if ((SceneLine *)local_258._0_8_ != (SceneLine *)0x0) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ - local_258._0_8_);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
  }
  tcu::Surface::~Surface((Surface *)&local_278);
  tcu::TestLog::endSection(local_1e8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus LineInterpolationTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitiveTopology);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;

			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			if (!verifyTriangulatedLineGroupInterpolation(resultImage, scene, args, m_context.getTestContext().getLog()))
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}